

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O3

void jpc_ict(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  jas_seqent_t **ppjVar1;
  jas_seqent_t **ppjVar2;
  jas_seqent_t **ppjVar3;
  jas_seqent_t *pjVar4;
  jas_seqent_t *pjVar5;
  jas_seqent_t *pjVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  
  uVar10 = (uint)c0->numrows_;
  if ((c1->numrows_ != (long)(int)uVar10) || (c2->numrows_ != c1->numrows_)) {
    __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                  ,0xbf,"void jpc_ict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
  }
  iVar11 = (int)c0->numcols_;
  if ((c1->numcols_ == (long)iVar11) && (c2->numcols_ == c1->numcols_)) {
    if (0 < (int)uVar10) {
      ppjVar1 = c0->rows_;
      ppjVar2 = c1->rows_;
      ppjVar3 = c2->rows_;
      uVar13 = 0;
      do {
        if (0 < iVar11) {
          pjVar4 = ppjVar3[uVar13];
          pjVar5 = ppjVar2[uVar13];
          pjVar6 = ppjVar1[uVar13];
          lVar14 = 0;
          uVar12 = iVar11 + 1;
          do {
            lVar7 = *(long *)((long)pjVar6 + lVar14);
            lVar8 = *(long *)((long)pjVar5 + lVar14);
            lVar9 = *(long *)((long)pjVar4 + lVar14);
            *(long *)((long)pjVar6 + lVar14) =
                 (lVar9 * 0x3a5 >> 0xd) + (lVar8 * 0x12c8 >> 0xd) + (lVar7 * 0x991 >> 0xd);
            *(long *)((long)pjVar5 + lVar14) =
                 (lVar9 >> 1) + (lVar8 * -0xa99 >> 0xd) + (lVar7 * -0x566 >> 0xd);
            *(long *)((long)pjVar4 + lVar14) =
                 (lVar9 * -0x29a >> 0xd) + (lVar8 * -0xd65 >> 0xd) + (lVar7 >> 1);
            lVar14 = lVar14 + 8;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uVar10 & 0x7fffffff));
    }
    return;
  }
  __assert_fail("jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0xc1,"void jpc_ict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_ict(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t r;
	jpc_fix_t g;
	jpc_fix_t b;
	jpc_fix_t y;
	jpc_fix_t u;
	jpc_fix_t v;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows);
	numcols = jas_matrix_numcols(c0);
	assert(jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols);
	for (i = 0; i < numrows; ++i) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			r = *c0p;
			g = *c1p;
			b = *c2p;
			y = jpc_fix_add3(jpc_fix_mul(jpc_dbltofix(0.299), r), jpc_fix_mul(jpc_dbltofix(0.587), g),
			  jpc_fix_mul(jpc_dbltofix(0.114), b));
			u = jpc_fix_add3(jpc_fix_mul(jpc_dbltofix(-0.16875), r), jpc_fix_mul(jpc_dbltofix(-0.33126), g),
			  jpc_fix_mul(jpc_dbltofix(0.5), b));
			v = jpc_fix_add3(jpc_fix_mul(jpc_dbltofix(0.5), r), jpc_fix_mul(jpc_dbltofix(-0.41869), g),
			  jpc_fix_mul(jpc_dbltofix(-0.08131), b));
			*c0p++ = y;
			*c1p++ = u;
			*c2p++ = v;
		}
	}
}